

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_ns_rm_all(lyxml_ctx *xmlctx)

{
  lyd_node *__ptr;
  uint local_1c;
  uint32_t i;
  lyxml_ns *ns;
  lyxml_ctx *xmlctx_local;
  
  for (local_1c = 0; local_1c < (xmlctx->ns).count; local_1c = local_1c + 1) {
    __ptr = (xmlctx->ns).field_2.dnodes[local_1c];
    free(*(void **)__ptr);
    free(__ptr->schema);
    free(__ptr);
  }
  ly_set_erase(&xmlctx->ns,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void
lyxml_ns_rm_all(struct lyxml_ctx *xmlctx)
{
    struct lyxml_ns *ns;
    uint32_t i;

    for (i = 0; i < xmlctx->ns.count; ++i) {
        ns = xmlctx->ns.objs[i];

        free(ns->prefix);
        free(ns->uri);
        free(ns);
    }
    ly_set_erase(&xmlctx->ns, NULL);
}